

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O3

_Bool los(chunk_conflict *c,loc_conflict grid1,loc_conflict grid2)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  loc lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  
  iVar11 = grid1.y;
  iVar9 = grid2.y;
  uVar8 = iVar9 - iVar11;
  iVar13 = grid2.x;
  iVar14 = grid1.x;
  uVar10 = iVar13 - iVar14;
  uVar7 = -uVar8;
  if (0 < (int)uVar8) {
    uVar7 = uVar8;
  }
  uVar6 = -uVar10;
  if (0 < (int)uVar10) {
    uVar6 = uVar10;
  }
  if (uVar6 < 2 && uVar7 < 2) {
    return true;
  }
  if (iVar13 == iVar14) {
    if ((int)uVar8 < 1) {
      do {
        iVar11 = iVar11 + -1;
        if (iVar11 <= iVar9) {
          return iVar11 <= iVar9;
        }
        lVar4 = (loc)loc(iVar14,iVar11);
        _Var1 = square_isprojectable(c,lVar4);
      } while (_Var1);
      return iVar11 <= iVar9;
    }
    do {
      iVar11 = iVar11 + 1;
      if (iVar9 <= iVar11) {
        return iVar9 <= iVar11;
      }
      lVar4 = (loc)loc(iVar14,iVar11);
      _Var1 = square_isprojectable(c,lVar4);
    } while (_Var1);
    return iVar9 <= iVar11;
  }
  if (iVar9 == iVar11) {
    if ((int)uVar10 < 1) {
      do {
        iVar14 = iVar14 + -1;
        if (iVar14 <= iVar13) {
          return iVar14 <= iVar13;
        }
        lVar4 = (loc)loc(iVar14,iVar11);
        _Var1 = square_isprojectable(c,lVar4);
      } while (_Var1);
      return iVar14 <= iVar13;
    }
    do {
      iVar14 = iVar14 + 1;
      if (iVar13 <= iVar14) {
        return iVar13 <= iVar14;
      }
      lVar4 = (loc)loc(iVar14,iVar11);
      _Var1 = square_isprojectable(c,lVar4);
    } while (_Var1);
    return iVar13 <= iVar14;
  }
  uVar2 = (int)uVar10 >> 0x1f | 1;
  uVar5 = (int)uVar8 >> 0x1f | 1;
  if (uVar7 == 2 && uVar6 == 1) {
    iVar3 = uVar5 + iVar11;
    iVar12 = iVar14;
  }
  else {
    if (uVar6 != 2 || uVar7 != 1) goto LAB_0012b519;
    iVar12 = uVar2 + iVar14;
    iVar3 = iVar11;
  }
  lVar4 = (loc)loc(iVar12,iVar3);
  _Var1 = square_isprojectable(c,lVar4);
  if (_Var1) {
    return true;
  }
LAB_0012b519:
  iVar3 = uVar7 * uVar6;
  if (uVar6 < uVar7) {
    iVar11 = uVar5 + iVar11;
    if (iVar11 != iVar9) {
      iVar12 = uVar10 * uVar10;
      iVar13 = 0;
      if (iVar12 == iVar3) {
        iVar13 = iVar3 * 2;
      }
      uVar7 = 0;
      if (iVar12 == iVar3) {
        uVar7 = uVar2;
      }
      iVar13 = iVar12 - iVar13;
      iVar14 = uVar7 + iVar14;
      do {
        lVar4 = (loc)loc(iVar14,iVar11);
        _Var1 = square_isprojectable(c,lVar4);
        if (!_Var1) {
          return false;
        }
        iVar13 = iVar13 + iVar12 * 2;
        if (iVar3 <= iVar13) {
          iVar14 = iVar14 + uVar2;
          if (iVar3 < iVar13) {
            lVar4 = (loc)loc(iVar14,iVar11);
            _Var1 = square_isprojectable(c,lVar4);
            if (!_Var1) {
              return false;
            }
          }
          iVar13 = iVar13 + iVar3 * -2;
        }
        iVar11 = iVar11 + uVar5;
      } while (iVar9 != iVar11);
    }
  }
  else {
    iVar14 = iVar14 + uVar2;
    if (iVar14 != iVar13) {
      iVar12 = uVar8 * uVar8;
      uVar7 = 0;
      iVar9 = 0;
      if (iVar12 == iVar3) {
        uVar7 = uVar5;
        iVar9 = iVar3 * 2;
      }
      iVar9 = iVar12 - iVar9;
      iVar11 = uVar7 + iVar11;
      do {
        lVar4 = (loc)loc(iVar14,iVar11);
        _Var1 = square_isprojectable(c,lVar4);
        if (!_Var1) {
          return false;
        }
        iVar9 = iVar9 + iVar12 * 2;
        if (iVar3 <= iVar9) {
          iVar11 = iVar11 + uVar5;
          if (iVar3 < iVar9) {
            lVar4 = (loc)loc(iVar14,iVar11);
            _Var1 = square_isprojectable(c,lVar4);
            if (!_Var1) {
              return false;
            }
          }
          iVar9 = iVar9 + iVar3 * -2;
        }
        iVar14 = iVar14 + uVar2;
      } while (iVar13 != iVar14);
    }
  }
  return true;
}

Assistant:

bool los(struct chunk *c, struct loc grid1, struct loc grid2)
{
	/* Delta */
	int dx, dy;

	/* Absolute */
	int ax, ay;

	/* Signs */
	int sx, sy;

	/* Fractions */
	int qx, qy;

	/* Scanners */
	int tx, ty;

	/* Scale factors */
	int f1, f2;

	/* Slope, or 1/Slope, of LOS */
	int m;

	/* Extract the offset */
	dy = grid2.y - grid1.y;
	dx = grid2.x - grid1.x;

	/* Extract the absolute offset */
	ay = ABS(dy);
	ax = ABS(dx);

	/* Handle adjacent (or identical) grids */
	if ((ax < 2) && (ay < 2)) return (true);

	/* Directly South/North */
	if (!dx) {
		/* South -- check for walls */
		if (dy > 0) {
			for (ty = grid1.y + 1; ty < grid2.y; ty++)
				if (!square_isprojectable(c, loc(grid1.x, ty))) return (false);
		} else { /* North -- check for walls */
			for (ty = grid1.y - 1; ty > grid2.y; ty--)
				if (!square_isprojectable(c, loc(grid1.x, ty))) return (false);
		}

		/* Assume los */
		return (true);
	}

	/* Directly East/West */
	if (!dy) {
		/* East -- check for walls */
		if (dx > 0) {
			for (tx = grid1.x + 1; tx < grid2.x; tx++)
				if (!square_isprojectable(c, loc(tx, grid1.y))) return (false);
		} else { /* West -- check for walls */
			for (tx = grid1.x - 1; tx > grid2.x; tx--)
				if (!square_isprojectable(c, loc(tx, grid1.y))) return (false);
		}

		/* Assume los */
		return (true);
	}


	/* Extract some signs */
	sx = (dx < 0) ? -1 : 1;
	sy = (dy < 0) ? -1 : 1;

	/* Vertical and horizontal "knights" */
	if ((ax == 1) && (ay == 2) &&
		square_isprojectable(c, loc(grid1.x, grid1.y + sy))) {
		return (true);
	} else if ((ay == 1) && (ax == 2) &&
			   square_isprojectable(c, loc(grid1.x + sx, grid1.y))) {
		return (true);
	}

	/* Calculate scale factor div 2 */
	f2 = (ax * ay);

	/* Calculate scale factor */
	f1 = f2 << 1;


	/* Travel horizontally */
	if (ax >= ay) {
		/* Let m = dy / dx * 2 * (dy * dx) = 2 * dy * dy */
		qy = ay * ay;
		m = qy << 1;

		tx = grid1.x + sx;

		/* Consider the special case where slope == 1. */
		if (qy == f2) {
			ty = grid1.y + sy;
			qy -= f1;
		} else {
			ty = grid1.y;
		}

		/* Note (below) the case (qy == f2), where */
		/* the LOS exactly meets the corner of a tile. */
		while (grid2.x - tx) {
			if (!square_isprojectable(c, loc(tx, ty)))
				return (false);

			qy += m;

			if (qy < f2) {
				tx += sx;
			} else if (qy > f2) {
				ty += sy;
				if (!square_isprojectable(c, loc(tx, ty)))
					return (false);
				qy -= f1;
				tx += sx;
			} else {
				ty += sy;
				qy -= f1;
				tx += sx;
			}
		}
	} else { /* Travel vertically */
		/* Let m = dx / dy * 2 * (dx * dy) = 2 * dx * dx */
		qx = ax * ax;
		m = qx << 1;

		ty = grid1.y + sy;

		if (qx == f2) {
			tx = grid1.x + sx;
			qx -= f1;
		} else {
			tx = grid1.x;
		}

		/* Note (below) the case (qx == f2), where */
		/* the LOS exactly meets the corner of a tile. */
		while (grid2.y - ty) {
			if (!square_isprojectable(c, loc(tx, ty)))
				return (false);

			qx += m;

			if (qx < f2) {
				ty += sy;
			} else if (qx > f2) {
				tx += sx;
				if (!square_isprojectable(c, loc(tx, ty)))
					return (false);
				qx -= f1;
				ty += sy;
			} else {
				tx += sx;
				qx -= f1;
				ty += sy;
			}
		}
	}

	/* Assume los */
	return (true);
}